

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::
PrintSerializedPbInterval<google::protobuf::DescriptorProto>
          (Generator *this,DescriptorProto *descriptor_proto,string_view name)

{
  Printer *this_00;
  Nullable<const_char_*> pcVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  long lVar3;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum local_138;
  string local_108;
  AlphaNum local_e8;
  string local_b8;
  string_view local_98;
  LogMessage local_88;
  Voidify local_75;
  int local_74;
  unsigned_long local_70;
  Nullable<const_char_*> local_68;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  size_t offset;
  undefined1 local_48 [8];
  string sp;
  DescriptorProto *descriptor_proto_local;
  Generator *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (Generator *)name._M_len;
  sp.field_2._8_8_ = descriptor_proto;
  std::__cxx11::string::string((string *)local_48);
  protobuf::MessageLite::SerializeToString((MessageLite *)sp.field_2._8_8_,(string *)local_48);
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)
       std::__cxx11::string::find((string *)&this->file_descriptor_serialized_,(ulong)local_48);
  local_70 = absl::lts_20250127::log_internal::GetReferenceableValue
                       ((unsigned_long)absl_log_internal_check_op_result);
  local_74 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_68 = absl::lts_20250127::log_internal::Check_GEImpl<unsigned_long,int>
                       (&local_70,&local_74,"offset >= 0");
  if (local_68 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_68);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/generator.cc"
               ,0x526,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_75,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_88);
  }
  this_00 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_98,
             "_globals[\'$name$\']._serialized_start=$serialized_start$\n_globals[\'$name$\']._serialized_end=$serialized_end$\n"
            );
  absl::lts_20250127::AlphaNum::AlphaNum(&local_e8,(unsigned_long)absl_log_internal_check_op_result)
  ;
  absl::lts_20250127::StrCat_abi_cxx11_(&local_b8,(lts_20250127 *)&local_e8,a);
  pcVar1 = absl_log_internal_check_op_result;
  lVar3 = std::__cxx11::string::size();
  absl::lts_20250127::AlphaNum::AlphaNum(&local_138,(unsigned_long)(pcVar1 + lVar3));
  absl::lts_20250127::StrCat_abi_cxx11_(&local_108,(lts_20250127 *)&local_138,a_00);
  protobuf::io::Printer::
  Print<char[5],std::basic_string_view<char,std::char_traits<char>>,char[17],std::__cxx11::string,char[15],std::__cxx11::string>
            (this_00,local_98,(char (*) [5])0x1d1c66d,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             (char (*) [17])"serialized_start",&local_b8,(char (*) [15])"serialized_end",&local_108)
  ;
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Generator::PrintSerializedPbInterval(
    const DescriptorProtoT& descriptor_proto, absl::string_view name) const {
  std::string sp;
  descriptor_proto.SerializeToString(&sp);
  size_t offset = file_descriptor_serialized_.find(sp);
  ABSL_CHECK_GE(offset, 0);

  printer_->Print(
      "_globals['$name$']._serialized_start=$serialized_start$\n"
      "_globals['$name$']._serialized_end=$serialized_end$\n",
      "name", name, "serialized_start", absl::StrCat(offset), "serialized_end",
      absl::StrCat(offset + sp.size()));
}